

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert_to_half_pass.cpp
# Opt level: O0

uint32_t __thiscall
spvtools::opt::ConvertToHalfPass::EquivFloatTypeId
          (ConvertToHalfPass *this,uint32_t ty_id,uint32_t width)

{
  Op OVar1;
  uint32_t uVar2;
  uint32_t vty_id;
  DefUseManager *this_00;
  Instruction *this_01;
  IRContext *this_02;
  TypeManager *this_03;
  Instruction *ty_inst;
  Type *reg_equiv_ty;
  uint32_t width_local;
  uint32_t ty_id_local;
  ConvertToHalfPass *this_local;
  
  this_00 = Pass::get_def_use_mgr(&this->super_Pass);
  this_01 = analysis::DefUseManager::GetDef(this_00,ty_id);
  OVar1 = opt::Instruction::opcode(this_01);
  if (OVar1 == OpTypeMatrix) {
    uVar2 = opt::Instruction::GetSingleWordInOperand(this_01,1);
    vty_id = opt::Instruction::GetSingleWordInOperand(this_01,0);
    ty_inst = (Instruction *)FloatMatrixType(this,uVar2,vty_id,width);
  }
  else {
    OVar1 = opt::Instruction::opcode(this_01);
    if (OVar1 == OpTypeVector) {
      uVar2 = opt::Instruction::GetSingleWordInOperand(this_01,1);
      ty_inst = (Instruction *)FloatVectorType(this,uVar2,width);
    }
    else {
      ty_inst = (Instruction *)FloatScalarType(this,width);
    }
  }
  this_02 = Pass::context(&this->super_Pass);
  this_03 = IRContext::get_type_mgr(this_02);
  uVar2 = analysis::TypeManager::GetTypeInstruction(this_03,(Type *)ty_inst);
  return uVar2;
}

Assistant:

uint32_t ConvertToHalfPass::EquivFloatTypeId(uint32_t ty_id, uint32_t width) {
  analysis::Type* reg_equiv_ty;
  Instruction* ty_inst = get_def_use_mgr()->GetDef(ty_id);
  if (ty_inst->opcode() == spv::Op::OpTypeMatrix)
    reg_equiv_ty = FloatMatrixType(ty_inst->GetSingleWordInOperand(1),
                                   ty_inst->GetSingleWordInOperand(0), width);
  else if (ty_inst->opcode() == spv::Op::OpTypeVector)
    reg_equiv_ty = FloatVectorType(ty_inst->GetSingleWordInOperand(1), width);
  else  // spv::Op::OpTypeFloat
    reg_equiv_ty = FloatScalarType(width);
  return context()->get_type_mgr()->GetTypeInstruction(reg_equiv_ty);
}